

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reinsertion_optimizer.h
# Opt level: O2

void __thiscall
bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
optimize<bvh::v2::ParallelExecutor>
          (ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,
          Executor<bvh::v2::ParallelExecutor> *executor,Config *config)

{
  ulong uVar1;
  float fVar2;
  Index IVar3;
  pointer pNVar4;
  ThreadPool *this_00;
  pointer puVar5;
  undefined1 auVar6 [16];
  float fVar7;
  bool bVar8;
  size_type __n;
  long lVar9;
  ulong uVar10;
  long lVar11;
  __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
  __first;
  pointer pRVar12;
  pointer pNVar13;
  unsigned_long uVar14;
  _Any_data *__stat_loc;
  unsigned_long uVar15;
  ulong uVar16;
  size_t i;
  ulong uVar17;
  unsigned_long uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_ZMM1 [64];
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  reference rVar23;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  candidates;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  reinsertions;
  Index local_10c;
  array<unsigned_long,_5UL> conflicts;
  unsigned_long local_e0;
  anon_class_24_3_b752b870 local_d8;
  Executor<bvh::v2::ParallelExecutor> *local_b8;
  ulong local_b0;
  Config *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  pointer local_88;
  vector<bool,_std::allocator<bool>_> touched;
  _Any_data local_58;
  undefined8 local_48;
  
  auVar22 = in_ZMM1._0_16_;
  fVar2 = config->batch_size_ratio;
  reinsertions.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reinsertions.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
  reinsertions.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  __n = ((long)(this->bvh_->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->bvh_->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
  local_a8 = config;
  std::vector<bool,_std::allocator<bool>_>::vector(&touched,__n,(allocator_type *)&conflicts);
  auVar22 = vcvtusi2ss_avx512f(auVar22,__n);
  lVar9 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar22._0_4_ * fVar2)));
  local_b0 = lVar9 + 1 + (ulong)(lVar9 == 0);
  uVar16 = 0;
  local_b8 = executor;
  while (uVar16 < local_a8->max_iter_count) {
    uVar10 = ((long)(this->bvh_->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->bvh_->nodes).
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
    candidates.
    super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
    if (local_b0 < uVar10) {
      uVar10 = local_b0;
    }
    candidates.
    super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar9 = 0x30;
    local_a0 = uVar16;
    for (uVar17 = 1; uVar17 < uVar10; uVar17 = uVar17 + 1) {
      pNVar4 = (this->bvh_->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar2 = *(float *)((long)&pNVar4->bounds + lVar9 + -0x10) -
              *(float *)((long)&pNVar4->bounds + lVar9 + -0x14);
      fVar7 = *(float *)((long)&pNVar4->bounds + lVar9 + -8) -
              *(float *)((long)&pNVar4->bounds + lVar9 + -0xc);
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar7)),
                                ZEXT416((uint)(*(float *)((long)&pNVar4->bounds + lVar9) -
                                              *(float *)((long)&pNVar4->bounds + lVar9 + -4))),
                                ZEXT416((uint)(fVar2 + fVar7)));
      conflicts._M_elems[1]._0_4_ = auVar22._0_4_;
      conflicts._M_elems[0] = uVar17;
      std::
      vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>
      ::emplace_back<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>
                ((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>
                  *)&candidates,(Candidate *)&conflicts);
      lVar9 = lVar9 + 0x1c;
    }
    std::
    make_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,std::greater<void>>
              (candidates.
               super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
               ._M_impl.super__Vector_impl_data._M_start,
               candidates.
               super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    lVar9 = uVar10 * 0x1c + 0x14;
    while( true ) {
      pNVar4 = (this->bvh_->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)(this->bvh_->nodes).
                     super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4;
      if ((ulong)(lVar11 / 0x1c) <= uVar10) break;
      fVar2 = *(float *)((long)&pNVar4->bounds + lVar9 + -0x10) -
              *(float *)((long)&pNVar4->bounds + lVar9 + -0x14);
      fVar7 = *(float *)((long)&pNVar4->bounds + lVar9 + -8) -
              *(float *)((long)&pNVar4->bounds + lVar9 + -0xc);
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar7)),
                                ZEXT416((uint)(*(float *)((long)&pNVar4->bounds + lVar9) -
                                              *(float *)((long)&pNVar4->bounds + lVar9 + -4))),
                                ZEXT416((uint)(fVar2 + fVar7)));
      if ((candidates.
           super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
           ._M_impl.super__Vector_impl_data._M_start)->cost < auVar22._0_4_) {
        std::
        pop_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,std::greater<void>>
                  (candidates.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   candidates.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                   ._M_impl.super__Vector_impl_data._M_finish,lVar11 % 0x1c);
        candidates.
        super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].node_id = uVar10;
        candidates.
        super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].cost = auVar22._0_4_;
        std::
        push_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,std::greater<void>>
                  (candidates.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x1c;
    }
    auVar22[0xf] = 0;
    auVar22._0_15_ = (undefined1  [15])conflicts._M_elems._1_15_;
    conflicts._M_elems._0_16_ = auVar22 << 8;
    __first_00.super__Bit_iterator_base._8_8_ = 0;
    __first_00.super__Bit_iterator_base._M_p =
         touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._M_p =
         touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p;
    __last.super__Bit_iterator_base._M_offset =
         touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    std::__fill_a1(__first_00,__last,(bool *)&conflicts);
    __stat_loc = (_Any_data *)
                 ((long)candidates.
                        super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)candidates.
                        super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::
    vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
    ::resize(&reinsertions,(size_type)__stat_loc);
    local_d8.reinsertions = &reinsertions;
    local_d8.candidates = &candidates;
    uVar16 = (long)candidates.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)candidates.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    local_d8.this = this;
    if (uVar16 < *(ulong *)(executor + 8)) {
      optimize<bvh::v2::ParallelExecutor>::anon_class_24_3_b752b870::operator()(&local_d8,0,uVar16);
    }
    else {
      uVar17 = uVar16 / (ulong)(*(long *)(*(long *)executor + 0x38) -
                                *(long *)(*(long *)executor + 0x30) >> 3);
      uVar10 = 0;
      while (uVar10 < uVar16) {
        conflicts._M_elems[1] = (unsigned_long)local_d8.this;
        conflicts._M_elems[0] = (unsigned_long)local_d8.reinsertions;
        this_00 = *(ThreadPool **)executor;
        uVar1 = uVar10 + uVar17 + (uVar17 == 0);
        conflicts._M_elems[4] = uVar16;
        if (uVar1 < uVar16) {
          conflicts._M_elems[4] = uVar1;
        }
        conflicts._M_elems[2] = (unsigned_long)local_d8.candidates;
        conflicts._M_elems[3] = uVar10;
        std::function<void_(unsigned_long)>::
        function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_executor_h:58:30),_void>
                  ((function<void_(unsigned_long)> *)&local_58,
                   (anon_class_40_3_92fce145_conflict1 *)&conflicts);
        __stat_loc = &local_58;
        ThreadPool::push(this_00,(Task *)&local_58);
        std::_Function_base::~_Function_base((_Function_base *)&local_58);
        uVar10 = uVar1;
      }
      ThreadPool::wait(*(ThreadPool **)executor,__stat_loc);
    }
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,__gnu_cxx::__ops::_Iter_pred<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(auto:1&)_1_>>
                        (reinsertions.
                         super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         reinsertions.
                         super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
    ::erase(&reinsertions,(const_iterator)__first._M_current,
            (const_iterator)
            reinsertions.
            super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
            ._M_impl.super__Vector_impl_data._M_finish);
    std::
    __sort<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (reinsertions.
               super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
               ._M_impl.super__Vector_impl_data._M_start,
               reinsertions.
               super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_88 = reinsertions.
               super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar12 = reinsertions.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar12 != local_88;
        pRVar12 = pRVar12 + 1) {
      conflicts._M_elems[1] = pRVar12->from;
      conflicts._M_elems[0] = pRVar12->to;
      conflicts._M_elems[2] =
           (-(ulong)((conflicts._M_elems[1] & 1) == 0) | 1) + conflicts._M_elems[1];
      puVar5 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      conflicts._M_elems[3] = puVar5[pRVar12->to];
      conflicts._M_elems[4] = puVar5[conflicts._M_elems[1]];
      bVar8 = std::
              any_of<unsigned_long*,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long)_1_>
                        (conflicts._M_elems,&local_e0,&touched);
      if (!bVar8) {
        for (lVar9 = 0; lVar9 != 0x28; lVar9 = lVar9 + 8) {
          rVar23 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&touched,*(size_type *)((long)conflicts._M_elems + lVar9));
          *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
        }
        local_90 = pRVar12->from;
        uVar14 = pRVar12->to;
        pNVar4 = (this->bvh_->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_90];
        uVar16 = (ulong)((local_90 & 1) == 0);
        uVar18 = (-uVar16 | 1) + local_90;
        local_48 = *(undefined8 *)((long)(pNVar4 + uVar18) + 0x10);
        local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&pNVar4[uVar18].bounds;
        local_58._8_8_ = *(undefined8 *)((long)&pNVar4[uVar18].bounds + 8);
        local_d8.candidates =
             *(vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
               **)((long)(pNVar4 + uVar14) + 0x10);
        local_98 = (ulong)((Index *)((long)(pNVar4 + uVar18) + 0x18))->value;
        local_d8.reinsertions =
             *(vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
               **)&pNVar4[uVar14].bounds;
        local_d8.this =
             *(ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)
              ((long)&pNVar4[uVar14].bounds + 8);
        IVar3.value = ((Index *)((long)(pNVar4 + uVar14) + 0x18))->value;
        Index<32UL,_4UL>::Index(&local_10c,local_90 - uVar16,0);
        pNVar4 = (this->bvh_->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ((Index *)((long)(pNVar4 + uVar14) + 0x18))->value = local_10c.value;
        *(vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
          **)((long)(pNVar4 + uVar18) + 0x10) = local_d8.candidates;
        *(vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          **)&pNVar4[uVar18].bounds = local_d8.reinsertions;
        *(ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)
         ((long)&pNVar4[uVar18].bounds + 8) = local_d8.this;
        ((Index *)((long)(pNVar4 + uVar18) + 0x18))->value = IVar3.value;
        pNVar4 = (this->bvh_->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)(pNVar4 + uVar15) + 0x10) = local_48;
        auVar19._8_8_ = local_58._8_8_;
        auVar19._0_8_ = local_58._M_unused._0_8_;
        *(undefined1 (*) [16])&pNVar4[uVar15].bounds = auVar19;
        ((Index *)((long)(pNVar4 + uVar15) + 0x18))->value = (Type)local_98;
        if ((IVar3.value & 0xf) == 0) {
          puVar5 = (this->parents_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar5[IVar3.value >> 4] = uVar18;
          puVar5[(ulong)(IVar3.value >> 4) + 1] = uVar18;
        }
        if ((local_98 & 0xf) == 0) {
          uVar16 = local_98 >> 4 & 0xfffffff;
          puVar5 = (this->parents_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar5[uVar16] = uVar15;
          puVar5[uVar16 + 1] = uVar15;
        }
        puVar5 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar5[uVar18] = uVar14;
        puVar5[local_90] = uVar14;
        pNVar4 = (this->bvh_->nodes).
                 super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          IVar3.value = ((Index *)((long)(pNVar4 + uVar14) + 0x18))->value;
          if ((IVar3.value & 0xf) == 0) {
            uVar16 = (ulong)(IVar3.value >> 4);
            pNVar13 = pNVar4 + uVar14;
            auVar22 = vminss_avx(ZEXT416(*(uint *)&pNVar4[uVar16].bounds),
                                 ZEXT416(*(uint *)&pNVar4[uVar16 + 1].bounds));
            auVar6 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar4 + uVar16) + 0x14)),
                                ZEXT416((uint)*(float *)((long)(pNVar4 + uVar16 + 1) + 0x14)));
            *(int *)&pNVar13->bounds = auVar22._0_4_;
            auVar19 = vgatherdps_avx512vl(pNVar4[uVar16].bounds._M_elems[0]);
            auVar20 = vgatherdps_avx512vl(*(undefined4 *)((long)&pNVar4[uVar16].bounds + uVar14));
            uVar16 = vcmpps_avx512vl(auVar20,auVar19,1);
            auVar22 = vblendps_avx(auVar19,auVar20,10);
            auVar19 = vblendps_avx(auVar20,auVar19,10);
            bVar8 = (bool)((byte)uVar16 & 1);
            auVar20._0_4_ = (uint)bVar8 * auVar22._0_4_ | (uint)!bVar8 * auVar19._0_4_;
            bVar8 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar20._4_4_ = (uint)bVar8 * auVar22._4_4_ | (uint)!bVar8 * auVar19._4_4_;
            bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar20._8_4_ = (uint)bVar8 * auVar22._8_4_ | (uint)!bVar8 * auVar19._8_4_;
            bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar20._12_4_ = (uint)bVar8 * auVar22._12_4_ | (uint)!bVar8 * auVar19._12_4_;
            *(undefined1 (*) [16])((long)&pNVar13->bounds + 4) = auVar20;
            *(float *)((long)&pNVar13->bounds + 0x14) = auVar6._0_4_;
          }
          uVar14 = puVar5[uVar14];
        } while (uVar14 != 0);
        do {
          IVar3.value = ((Index *)((long)(pNVar4 + uVar15) + 0x18))->value;
          if ((IVar3.value & 0xf) == 0) {
            uVar16 = (ulong)(IVar3.value >> 4);
            pNVar13 = pNVar4 + uVar15;
            auVar22 = vminss_avx(ZEXT416(*(uint *)&pNVar4[uVar16].bounds),
                                 ZEXT416(*(uint *)&pNVar4[uVar16 + 1].bounds));
            auVar6 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar4 + uVar16) + 0x14)),
                                ZEXT416((uint)*(float *)((long)(pNVar4 + uVar16 + 1) + 0x14)));
            *(int *)&pNVar13->bounds = auVar22._0_4_;
            auVar19 = vgatherdps_avx512vl(pNVar4[uVar16].bounds._M_elems[0]);
            auVar20 = vgatherdps_avx512vl(*(undefined4 *)(local_b8 + (long)&pNVar4[uVar16].bounds));
            uVar16 = vcmpps_avx512vl(auVar20,auVar19,1);
            auVar22 = vblendps_avx(auVar19,auVar20,10);
            auVar19 = vblendps_avx(auVar20,auVar19,10);
            bVar8 = (bool)((byte)uVar16 & 1);
            auVar21._0_4_ = (uint)bVar8 * auVar22._0_4_ | (uint)!bVar8 * auVar19._0_4_;
            bVar8 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar21._4_4_ = (uint)bVar8 * auVar22._4_4_ | (uint)!bVar8 * auVar19._4_4_;
            bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar21._8_4_ = (uint)bVar8 * auVar22._8_4_ | (uint)!bVar8 * auVar19._8_4_;
            bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar21._12_4_ = (uint)bVar8 * auVar22._12_4_ | (uint)!bVar8 * auVar19._12_4_;
            *(undefined1 (*) [16])((long)&pNVar13->bounds + 4) = auVar21;
            *(float *)((long)&pNVar13->bounds + 0x14) = auVar6._0_4_;
          }
          uVar15 = puVar5[uVar15];
        } while (uVar15 != 0);
      }
      executor = local_b8;
    }
    std::
    _Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
    ::~_Vector_base(&candidates.
                     super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                   );
    uVar16 = local_a0 + 1;
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&touched.super__Bvector_base<std::allocator<bool>_>);
  std::
  _Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ::~_Vector_base(&reinsertions.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                 );
  return;
}

Assistant:

void optimize(Executor<Derived>& executor, const Config& config) {
        auto batch_size = std::max(size_t{1},
            static_cast<size_t>(static_cast<Scalar>(bvh_.nodes.size()) * config.batch_size_ratio));
        std::vector<Reinsertion> reinsertions;
        std::vector<bool> touched(bvh_.nodes.size());

        for (size_t iter = 0; iter < config.max_iter_count; ++iter) {
            auto candidates = find_candidates(batch_size);

            std::fill(touched.begin(), touched.end(), false);
            reinsertions.resize(candidates.size());
            executor.for_each(0, candidates.size(),
                [&] (size_t begin, size_t end) {
                    for (size_t i = begin; i < end; ++i)
                        reinsertions[i] = find_reinsertion(candidates[i].node_id);
                });

            reinsertions.erase(std::remove_if(reinsertions.begin(), reinsertions.end(),
                [] (auto& r) { return r.area_diff <= 0; }), reinsertions.end());
            std::sort(reinsertions.begin(), reinsertions.end(), std::greater<>{});

            for (auto& reinsertion : reinsertions) {
                auto conflicts = get_conflicts(reinsertion.from, reinsertion.to);
                if (std::any_of(conflicts.begin(), conflicts.end(), [&] (size_t i) { return touched[i]; }))
                    continue;
                for (auto conflict : conflicts)
                    touched[conflict] = true;
                reinsert_node(reinsertion.from, reinsertion.to);
            }
        }
    }